

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hex.c
# Opt level: O0

void test_hex_decode(void)

{
  int iVar1;
  size_t sVar2;
  char expect [17];
  char buffer [256];
  char hex [35];
  undefined8 local_148;
  undefined8 local_140;
  undefined1 local_138;
  undefined1 local_128 [160];
  char local_28 [40];
  
  memcpy(local_28,"000102030405060708090a0B0c0D0e0fFf",0x23);
  local_148 = 0x706050403020100;
  local_140 = 0xf0e0d0c0b0a0908;
  local_138 = 0xff;
  sVar2 = strlen(local_28);
  iVar1 = hex_decode(local_28,(uint)sVar2,local_128,0x100);
  acutest_check_((int)(ulong)(iVar1 == 0x11),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x37,"%s","hex_decode(hex, strlen(hex), buffer, sizeof(buffer)) == sizeof(expect)"
                );
  iVar1 = memcmp(local_128,&local_148,0x11);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-hex.c"
                 ,0x38,"%s","memcmp(buffer, expect, sizeof(expect)) == 0");
  return;
}

Assistant:

static void
test_hex_decode(void)
{
    /* Keep the visually ugly mixed lower and upper case here. */
    char hex[] = "000102030405060708090a0B0c0D0e0fFf";
    char buffer[256];
    char expect[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 0xff };

    TEST_CHECK(hex_decode(hex, strlen(hex), buffer, sizeof(buffer)) == sizeof(expect));
    TEST_CHECK(memcmp(buffer, expect, sizeof(expect)) == 0);
}